

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O3

error_code __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
set_verify_callback<std::_Bind<bool(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,asio::ssl::verify_context&)>>
          (stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *this,
          _Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
          *callback,error_code *ec)

{
  SSL *s;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  int mode;
  undefined8 *data;
  void *pvVar3;
  long *plVar4;
  error_category *peVar5;
  
  data = (undefined8 *)operator_new(0x20);
  uVar2 = *(undefined8 *)&callback->field_0x8;
  data[1] = callback->_M_f;
  data[2] = uVar2;
  data[3] = (callback->_M_bound_args).
            super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>
            .super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl;
  *data = &PTR__verify_callback_base_0061c118;
  pvVar3 = SSL_get_ex_data(*(SSL **)(this + 8),0);
  if (pvVar3 != (void *)0x0) {
    plVar4 = (long *)SSL_get_ex_data(*(SSL **)(this + 8),0);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
  }
  SSL_set_ex_data(*(SSL **)(this + 8),0,data);
  s = *(SSL **)(this + 8);
  mode = SSL_get_verify_mode(s);
  SSL_set_verify(s,mode,detail::engine::verify_callback_function);
  peVar5 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = peVar5;
  return (error_code)(auVar1 << 0x40);
}

Assistant:

ASIO_SYNC_OP_VOID set_verify_callback(VerifyCallback callback,
      asio::error_code& ec)
  {
    core_.engine_.set_verify_callback(
        new detail::verify_callback<VerifyCallback>(callback), ec);
    ASIO_SYNC_OP_VOID_RETURN(ec);
  }